

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void __thiscall Window::_q_filesFound(Window *this)

{
  QFutureWatcher<QList<QString>_> *this_00;
  bool bVar1;
  WindowPrivate *pWVar2;
  const_reference other;
  QList<QString> *pQVar3;
  QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_> *pQVar4;
  QList<QString> **in_R9;
  undefined1 local_d8 [32];
  QString local_b8;
  QString local_a0;
  QList<QString> local_88;
  QFuture<QList<QString>_> local_68;
  undefined1 local_58 [8];
  QString path;
  QList<QString> local_30;
  byte local_11;
  Window *pWStack_10;
  bool start;
  Window *this_local;
  
  pQVar4 = &this->d;
  pWStack_10 = this;
  pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->(pQVar4);
  local_11 = QList<QString>::isEmpty(&pWVar2->imageFiles);
  pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->(pQVar4);
  QFuture<QList<QString>>::result<QList<QString>,void>
            (&local_30,(QFuture<QList<QString>> *)&pWVar2->fileFuture);
  pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->(pQVar4);
  QList<QString>::operator+=(&pWVar2->imageFiles,&local_30);
  QList<QString>::~QList(&local_30);
  if ((local_11 & 1) != 0) {
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (&this->d);
    WindowPrivate::loadImages(pWVar2);
  }
  pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                     (&this->d);
  bVar1 = QList<QString>::isEmpty(&pWVar2->imageLocations);
  if (!bVar1) {
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (&this->d);
    other = QList<QString>::at(&pWVar2->imageLocations,0);
    QString::QString((QString *)local_58,other);
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (&this->d);
    QList<QString>::removeFirst(&pWVar2->imageLocations);
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (QString *)0x0;
    local_88.d.size = 0;
    QList<QString>::QList(&local_88);
    QString::QString(&local_a0,"*.jpg");
    pQVar3 = QList<QString>::operator<<(&local_88,&local_a0);
    QString::QString(&local_b8,"*.jpeg");
    pQVar3 = QList<QString>::operator<<(pQVar3,&local_b8);
    QString::QString((QString *)(local_d8 + 8),"*.png");
    pQVar3 = QList<QString>::operator<<(pQVar3,(rvalue_ref)(local_d8 + 8));
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (&this->d);
    local_d8._0_8_ = &pWVar2->imageLocations;
    QtConcurrent::
    run<QList<QString>(&)(QString_const&,QList<QString>const&,QList<QString>*),QString_const&,QList<QString>&,QList<QString>*>
              (&local_68,(QtConcurrent *)findFiles,
               (_func_QList<QString>_QString_ptr_QList<QString>_ptr_QList<QString>_ptr *)local_58,
               (QString *)pQVar3,(QList<QString> *)local_d8,in_R9);
    pQVar4 = &this->d;
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (pQVar4);
    QFuture<QList<QString>_>::operator=(&pWVar2->fileFuture,&local_68);
    QFuture<QList<QString>_>::~QFuture(&local_68);
    QString::~QString((QString *)(local_d8 + 8));
    QString::~QString(&local_b8);
    QString::~QString(&local_a0);
    QList<QString>::~QList(&local_88);
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (pQVar4);
    this_00 = pWVar2->filesFutureWatcher;
    pWVar2 = QScopedPointer<WindowPrivate,_QScopedPointerDeleter<WindowPrivate>_>::operator->
                       (pQVar4);
    QFutureWatcher<QList<QString>_>::setFuture(this_00,&pWVar2->fileFuture);
    QString::~QString((QString *)local_58);
  }
  return;
}

Assistant:

void
Window::_q_filesFound()
{
	const bool start = d->imageFiles.isEmpty();

	d->imageFiles += d->fileFuture.result();

	if( start )
		d->loadImages();

	if( !d->imageLocations.isEmpty() )
	{
		const QString path = d->imageLocations.at( 0 );
		d->imageLocations.removeFirst();

		d->fileFuture = QtConcurrent::run(
			findFiles, path,
			QStringList() << "*.jpg" << "*.jpeg" << "*.png",
			&d->imageLocations );

		d->filesFutureWatcher->setFuture( d->fileFuture );
	}
}